

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O0

directory * dlib::get_parent_directory(file *f)

{
  long lVar1;
  string *psVar2;
  file *in_RSI;
  string *in_RDI;
  size_type pos;
  string *this;
  string local_38 [32];
  long local_18;
  file *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  file::full_name_abi_cxx11_(in_RSI);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    directory::directory((directory *)0x3d29bd);
  }
  else {
    psVar2 = file::full_name_abi_cxx11_(local_10);
    local_18 = std::__cxx11::string::find_last_of((char *)psVar2,0x4d5ec5);
    if (local_18 == -1) {
      directory::directory((directory *)0x3d29f9);
    }
    else {
      psVar2 = file::full_name_abi_cxx11_(local_10);
      std::__cxx11::string::substr((ulong)local_38,(ulong)psVar2);
      directory::directory((directory *)this,in_RDI);
      std::__cxx11::string::~string(local_38);
    }
  }
  return (directory *)this;
}

Assistant:

directory get_parent_directory (
        const file& f
    )
    {
        if (f.full_name().size() == 0)
            return directory();

        std::string::size_type pos = f.full_name().find_last_of("\\/");
        
        if (pos == std::string::npos)
            return directory();

        return directory(f.full_name().substr(0,pos));
    }